

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleWriteCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool append)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  reference pbVar4;
  string *psVar5;
  char *pcVar6;
  const_iterator end;
  _Ios_Openmode _Var7;
  string local_3f8 [39];
  allocator<char> local_3d1;
  undefined1 local_3d0 [8];
  string error_1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_380;
  undefined1 local_370 [8];
  string message;
  allocator<char> local_329;
  undefined1 local_328 [8];
  string error;
  ofstream file;
  mode_t newMode;
  undefined1 local_f8 [3];
  bool writable;
  mode_t mode;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_58 [8];
  string fileName;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  bool append_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current._7_1_ = append;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  fileName.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pbVar4 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  std::__cxx11::string::string((string *)local_58,(string *)pbVar4);
  pbVar4 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  bVar1 = cmsys::SystemTools::FileIsFullPath(pbVar4);
  if (!bVar1) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator=((string *)local_58,(string *)psVar5);
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    std::operator+(&local_88,"/",pbVar4);
    std::__cxx11::string::operator+=((string *)local_58,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  e.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  bVar1 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,(string *)local_58);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)local_f8,(string *)local_58);
    cmsys::SystemTools::MakeDirectory((string *)local_f8,(mode_t *)0x0);
    newMode = 0;
    bVar1 = false;
    bVar2 = cmsys::SystemTools::GetPermissions((string *)local_58,&newMode);
    if (bVar2) {
      bVar1 = (newMode & 0x80) != 0;
      if (!bVar1) {
        cmsys::SystemTools::SetPermissions((string *)local_58,newMode | 0x90,false);
      }
    }
    pcVar6 = (char *)std::__cxx11::string::c_str();
    _Var7 = _S_out;
    if ((i._M_current._7_1_ & 1) != 0) {
      _Var7 = _S_app;
    }
    std::ofstream::ofstream((void *)((long)&error.field_2 + 8),pcVar6,_Var7);
    bVar3 = std::ios::operator!((ios *)((long)&error.field_2 +
                                       *(long *)(error.field_2._8_8_ + -0x18) + 8));
    begin._M_current = local_30._M_current;
    if ((bVar3 & 1) == 0) {
      end = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(args);
      local_380 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (begin,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )end._M_current);
      std::__cxx11::string::string((string *)(error_1.field_2._M_local_buf + 8));
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((string *)local_370,&local_380,(string *)(error_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(error_1.field_2._M_local_buf + 8));
      std::operator<<((ostream *)((long)&error.field_2 + 8),(string *)local_370);
      bVar3 = std::ios::operator!((ios *)((long)&error.field_2 +
                                         *(long *)(error.field_2._8_8_ + -0x18) + 8));
      if ((bVar3 & 1) == 0) {
        std::ofstream::close();
        if ((newMode != 0) && (!bVar1)) {
          cmsys::SystemTools::SetPermissions((string *)local_58,newMode,false);
        }
        this_local._7_1_ = true;
        dir.field_2._12_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3d0,"write failed (",&local_3d1);
        std::allocator<char>::~allocator(&local_3d1);
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::__cxx11::string::operator+=((string *)local_3d0,local_3f8);
        std::__cxx11::string::~string(local_3f8);
        std::__cxx11::string::operator+=((string *)local_3d0,"):\n  ");
        std::__cxx11::string::operator+=((string *)local_3d0,(string *)local_58);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_3d0);
        this_local._7_1_ = false;
        dir.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_3d0);
      }
      std::__cxx11::string::~string((string *)local_370);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_328,"failed to open for writing (",&local_329);
      std::allocator<char>::~allocator(&local_329);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::operator+=
                ((string *)local_328,(string *)(message.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_328,"):\n  ");
      std::__cxx11::string::operator+=((string *)local_328,(string *)local_58);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_328);
      this_local._7_1_ = false;
      dir.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_328);
    }
    std::ofstream::~ofstream((void *)((long)&error.field_2 + 8));
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    std::operator+(&local_d0,"attempted to write a file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_d0," into a source directory.");
    std::__cxx11::string::~string((string *)&local_d0);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_b0);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = false;
    dir.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmFileCommand::HandleWriteCommand(std::vector<std::string> const& args,
                                       bool append)
{
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + *i;
  }

  i++;

  if (!this->Makefile->CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error = "failed to open for writing (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error = "write failed (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}